

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O2

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = bitD->bitsConsumed + (uint)(ushort)*dt;
  uVar1 = BIT_mask[(ushort)*dt];
  bitD->bitsConsumed = uVar2;
  DStatePtr->state = (ulong)((uint)(bitD->bitContainer >> (-(char)uVar2 & 0x3fU)) & uVar1);
  BIT_reloadDStream(bitD);
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}